

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_controller
          (NodeLoader *this,instance_controller__AttributeData *attributeData)

{
  Node *pNVar1;
  _Elt_pointer ppNVar2;
  UniqueId *pUVar3;
  GeometryMaterialIdInfo *pGVar4;
  InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431> *this_00;
  InstanceControllerDataList *this_01;
  UniqueId instantiatedControllerUniqueId;
  InstanceController *instanceController;
  UniqueId uniqueId;
  InstanceControllerData instanceControllerData;
  UniqueId local_78;
  InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431> *local_58;
  UniqueId local_50;
  value_type local_38;
  
  ppNVar2 = (this->mNodeStack).c.
            super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppNVar2 ==
      (this->mNodeStack).c.super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppNVar2 = (this->mNodeStack).c.
              super__Deque_base<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pNVar1 = ppNVar2[-1];
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader,&attributeData->url,SKIN_DATA,false);
  local_78.mClassId = pUVar3->mClassId;
  local_78._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  local_78.mObjectId = pUVar3->mObjectId;
  local_78.mFileId = pUVar3->mFileId;
  pGVar4 = IFilePartLoader::getMeshMaterialIdInfo
                     (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                       super_IFilePartLoader);
  this->mCurrentMaterialInfo = pGVar4;
  IFilePartLoader::createUniqueId
            (&local_50,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             INSTANCE_CONTROLLER);
  this_00 = (InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431> *)operator_new(0x98);
  COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>::InstanceBindingBase
            (this_00,&local_50,&local_78);
  this->mCurrentInstanceController = this_00;
  local_58 = this_00;
  COLLADAFW::
  ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>_*>::
  append(&(pNVar1->mInstanceControllers).
          super_ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>_*>
         ,&local_58);
  local_38.skeletonRoots.super__List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38.skeletonRoots.super__List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl.
  _M_node._M_size = 0;
  local_38.instanceController = local_58;
  local_38.skeletonRoots.super__List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       local_38.skeletonRoots.super__List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  this_01 = IFilePartLoader::getInstanceControllerDataListByControllerUniqueId_abi_cxx11_
                      (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->
                        super_IFilePartLoader,&local_78);
  std::__cxx11::
  list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>
  ::push_back(this_01,&local_38);
  this->mCurrentInstanceControllerData =
       (InstanceControllerData *)
       ((this_01->
        super__List_base<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>
        )._M_impl._M_node.super__List_node_base._M_prev + 1);
  std::__cxx11::_List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>::_M_clear
            ((_List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_> *)&local_38);
  COLLADAFW::UniqueId::~UniqueId(&local_50);
  COLLADAFW::UniqueId::~UniqueId(&local_78);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_controller( const instance_controller__AttributeData& attributeData )
	{
		COLLADAFW::Node* currentNode = mNodeStack.top();
		COLLADAFW::UniqueId instantiatedControllerUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::SkinControllerData::ID() );
		mCurrentMaterialInfo = &getHandlingFilePartLoader()->getMeshMaterialIdInfo();

        COLLADAFW::UniqueId uniqueId = getHandlingFilePartLoader()->createUniqueId ( COLLADAFW::InstanceController::ID() );
		COLLADAFW::InstanceController* instanceController = FW_NEW COLLADAFW::InstanceController( uniqueId, instantiatedControllerUniqueId);
		mCurrentInstanceController = instanceController;
		currentNode->getInstanceControllers().append(instanceController);

		Loader::InstanceControllerData instanceControllerData;
		instanceControllerData.instanceController = instanceController;
		Loader::InstanceControllerDataList& instanceControllerDataList = getHandlingFilePartLoader()->getInstanceControllerDataListByControllerUniqueId(instantiatedControllerUniqueId);
		instanceControllerDataList.push_back(instanceControllerData);
		mCurrentInstanceControllerData = &instanceControllerDataList.back();

		return true;
	}